

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_somfy.c
# Opt level: O0

int dehexify(char *in,size_t bytes,uchar *out)

{
  int iVar1;
  size_t sVar2;
  uint local_2c;
  int x;
  int i;
  uchar *out_local;
  size_t bytes_local;
  char *in_local;
  
  sVar2 = strlen(in);
  if (sVar2 < bytes << 1) {
    in_local._4_4_ = -1;
  }
  else {
    memset(out,0,bytes);
    for (local_2c = 0; (ulong)(long)(int)local_2c < bytes; local_2c = local_2c + 1) {
      iVar1 = dehex_nibble((int)in[(int)(local_2c << 1)]);
      if ((iVar1 < 0) || (0xf < iVar1)) {
        return -1;
      }
      out[(int)local_2c] = (uchar)(iVar1 << 4);
      iVar1 = dehex_nibble((int)in[(int)(local_2c * 2 + 1)]);
      if ((iVar1 < 0) || (0xf < iVar1)) {
        return -1;
      }
      out[(int)local_2c] = out[(int)local_2c] | (byte)iVar1;
      printf("%d - %x\n",(ulong)local_2c,(ulong)out[(int)local_2c]);
    }
    in_local._4_4_ = 0;
  }
  return in_local._4_4_;
}

Assistant:

int dehexify(char *in, size_t bytes, unsigned char *out)
{
	int i;
	int x;

	if (strlen(in) < bytes*2) {
		return -1;
	}

	memset(out, 0, bytes);
	for (i=0; i<bytes; i++) {
		x = dehex_nibble(in[(i*2)]);
		if (x < 0 || x > 15)
			return -1;
		out[i] = (x << 4);

		x = dehex_nibble(in[(i*2)+1]);
		if (x < 0 || x > 15)
			return -1;
		out[i] |= x;

		printf("%d - %x\n", i, out[i]);
	}

	return 0;
}